

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * anon_unknown.dwarf_22bf96::GetLoadStoreInfo
                    (VmModule *module,VmValue *loadPointer,VmConstant *loadOffset,uint loadSize,
                    uint accessSize,VmInstructionType loadCmd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  LoadStoreInfo *pLVar5;
  VmValue *pVVar6;
  LoadStoreInfo *pLVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  VmValue *pVVar11;
  VmConstant *pVVar12;
  int value;
  uint uVar13;
  Allocator *pAVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  double value_00;
  
  if ((loadPointer == (VmValue *)0x0) || (loadPointer->typeID != 1)) {
    uVar19 = (ulong)(module->loadStoreInfo).count;
    if (uVar19 != 0) {
      pLVar7 = (module->loadStoreInfo).data;
      lVar15 = 0;
      do {
        pVVar6 = *(VmValue **)((long)&pLVar7->loadInst + lVar15);
        if ((((pVVar6 != (VmValue *)0x0) &&
             (pVVar11 = *(VmValue **)((long)&pLVar7->loadPointer + lVar15),
             pVVar11 == loadPointer && pVVar11 != (VmValue *)0x0)) &&
            (*(int *)(*(long *)((long)&pLVar7->loadOffset + lVar15) + 0x98) == loadOffset->iValue))
           && (*(uint *)((long)&pLVar7->accessSize + lVar15) == accessSize)) {
          if (*(long *)((long)(pVVar6 + 1) + 0x40) != 0) {
            return pVVar6;
          }
          __assert_fail("el.loadInst->parent",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x6c7,
                        "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                       );
        }
        lVar15 = lVar15 + 0x58;
      } while (uVar19 * 0x58 - lVar15 != 0);
    }
  }
  else if (loadPointer[1].comment.end != (char *)0x0) {
    if (loadOffset->iValue != 0) {
      __assert_fail("loadOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x692,
                    "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                   );
    }
    if ((module->loadStoreInfo).count != 0) {
      uVar19 = 0;
      do {
        pLVar5 = (module->loadStoreInfo).data;
        pLVar7 = pLVar5 + uVar19;
        if (((pLVar5[uVar19].loadInst != (VmInstruction *)0x0) &&
            (pLVar7->loadAddress != (VmConstant *)0x0)) &&
           ((bVar10 = VmConstant::operator==(pLVar7->loadAddress,(VmConstant *)loadPointer), bVar10
            && (pLVar7->accessSize == accessSize)))) {
          if (pLVar7->loadInst->parent != (VmBlock *)0x0) {
            return &pLVar7->loadInst->super_VmValue;
          }
          __assert_fail("el.loadInst->parent",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x69d,
                        "VmValue *(anonymous namespace)::GetLoadStoreInfo(VmModule *, VmValue *, VmConstant *, unsigned int, unsigned int, VmInstructionType)"
                       );
        }
        if ((pLVar7->storeInst == (VmInstruction *)0x0) ||
           (pLVar7->storeAddress == (VmConstant *)0x0)) goto switchD_0027e931_caseD_1;
        bVar10 = VmConstant::operator==(pLVar7->storeAddress,(VmConstant *)loadPointer);
        uVar1 = pLVar7->accessSize;
        if (uVar1 == accessSize && bVar10) {
          if (2 < (pLVar7->storeInst->arguments).count) {
            pVVar6 = (pLVar7->storeInst->arguments).data[2];
            if (*(uint *)((long)&pVVar6->type + 4) != loadSize) {
              return (VmValue *)0x0;
            }
            return pVVar6;
          }
LAB_0027ea91:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        if (uVar1 < accessSize ||
            pLVar7->storeAddress->container != (VariableData *)loadPointer[1].comment.end)
        goto switchD_0027e931_caseD_1;
        if ((pLVar7->storeInst->arguments).count < 3) goto LAB_0027ea91;
        pVVar6 = (pLVar7->storeInst->arguments).data[2];
        if (pVVar6 == (VmValue *)0x0) goto switchD_0027e931_caseD_1;
        uVar2 = pLVar7->storeAddress->iValue;
        uVar3 = *(uint *)&loadPointer[1]._vptr_VmValue;
        if (pVVar6->typeID == 2) {
          bVar10 = uVar2 == 0;
          pVVar11 = pVVar6;
          uVar17 = uVar3;
          while (((bVar10 && (*(int *)(pVVar11 + 1) - 0x49U < 2)) &&
                 (uVar8 = pVVar11 + 1, (ulong)*(uint *)(uVar8 + 0x10) != 0))) {
            uVar9 = pVVar11 + 1;
            uVar18 = 0;
            uVar16 = 0;
            while( true ) {
              pVVar11 = *(VmValue **)(*(long *)(uVar9 + 8) + uVar18 * 8);
              uVar4 = *(uint *)((long)&pVVar11->type + 4);
              if (uVar4 == accessSize && uVar17 == uVar16) {
                return pVVar11;
              }
              bVar10 = uVar16 <= uVar17;
              uVar13 = uVar17 - uVar16;
              uVar16 = uVar16 + uVar4;
              if (uVar17 + accessSize <= uVar16 && bVar10) break;
              uVar18 = uVar18 + 1;
              if (*(uint *)(uVar8 + 0x10) == uVar18) goto LAB_0027e8d6;
            }
            bVar10 = true;
            uVar17 = uVar13;
            if (pVVar11->typeID != 2) break;
          }
        }
LAB_0027e8d6:
        uVar18 = (ulong)(uVar3 - uVar2);
        if (((uVar3 < uVar2) || (pVVar6->typeID != 1)) || (uVar2 + uVar1 < uVar3 + accessSize))
        goto switchD_0027e931_caseD_1;
        lVar15 = *(long *)((long)(pVVar6 + 1) + 0x18);
        if (lVar15 == 0) {
          __assert_fail("constant->sValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x663,
                        "VmValue *(anonymous namespace)::TryExtractConstant(VmModule *, VmValue *, unsigned int, unsigned int, unsigned int, unsigned int, VmInstructionType)"
                       );
        }
        switch(loadCmd) {
        case VM_INST_LOAD_BYTE:
          pAVar14 = module->allocator;
          value = (int)*(char *)(lVar15 + uVar18);
          break;
        default:
          goto switchD_0027e931_caseD_1;
        case VM_INST_LOAD_INT:
          value = *(int *)(lVar15 + uVar18);
          pAVar14 = module->allocator;
          break;
        case VM_INST_LOAD_FLOAT:
          pAVar14 = module->allocator;
          value_00 = (double)*(float *)(lVar15 + uVar18);
          goto LAB_0027e96d;
        case VM_INST_LOAD_DOUBLE:
          value_00 = *(double *)(lVar15 + uVar18);
          pAVar14 = module->allocator;
LAB_0027e96d:
          pVVar12 = CreateConstantDouble(pAVar14,(SynBase *)0x0,value_00);
          goto LAB_0027e988;
        case VM_INST_LOAD_LONG:
          pVVar12 = CreateConstantLong(module->allocator,(SynBase *)0x0,
                                       *(longlong *)(lVar15 + uVar18));
          goto LAB_0027e988;
        }
        pVVar12 = CreateConstantInt(pAVar14,(SynBase *)0x0,value);
LAB_0027e988:
        if (pVVar12 != (VmConstant *)0x0) {
          return &pVVar12->super_VmValue;
        }
switchD_0027e931_caseD_1:
        uVar19 = uVar19 + 1;
      } while (uVar19 < (module->loadStoreInfo).count);
    }
  }
  return (VmValue *)0x0;
}

Assistant:

VmValue* GetLoadStoreInfo(VmModule *module, VmValue *loadPointer, VmConstant *loadOffset, unsigned loadSize, unsigned accessSize, VmInstructionType loadCmd)
	{
		if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
		{
			if(!loadAddress->container)
				return NULL;

			assert(loadOffset->iValue == 0);

			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				// Reuse previous load
				if(el.loadInst && el.loadAddress)
				{
					if(*el.loadAddress == *loadAddress && accessSize == el.accessSize)
					{
						assert(el.loadInst->parent);

						return el.loadInst;
					}
				}

				// Reuse store argument
				if(el.storeInst && el.storeAddress)
				{
					if(*el.storeAddress == *loadAddress && accessSize == el.accessSize)
					{
						VmValue *value = el.storeInst->arguments[2];

						// Can't reuse arguments of a different size
						if(value->type.size != loadSize)
							return NULL;

						return value;
					}

					if(el.storeAddress->container == loadAddress->container && accessSize <= el.accessSize)
					{
						if(VmValue *component = TryExtractConstructElement(el.storeInst->arguments[2], el.storeAddress->iValue, loadAddress->iValue, accessSize))
							return component;

						if(VmValue *constant = TryExtractConstant(module, el.storeInst->arguments[2], el.storeAddress->iValue, el.accessSize, loadAddress->iValue, accessSize, loadCmd))
							return constant;
					}
				}
			}
		}
		else
		{
			for(unsigned i = 0; i < module->loadStoreInfo.size(); i++)
			{
				VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

				// Reuse previous load
				if(el.loadInst && el.loadPointer)
				{
					if(el.loadPointer == loadPointer && el.loadOffset->iValue == loadOffset->iValue && accessSize == el.accessSize)
					{
						assert(el.loadInst->parent);

						return el.loadInst;
					}
				}
			}
		}

		return NULL;
	}